

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O3

bool __thiscall Pda::traverse(Pda *this,string *input)

{
  char cVar1;
  Pda *n;
  pointer ppNVar2;
  size_t __n;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  vector<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_> *pvVar7;
  char *pcVar8;
  pointer ppTVar9;
  _Elt_pointer pcVar10;
  Node *pNVar11;
  Node *pNVar12;
  Pda *pPVar13;
  string *psVar14;
  string *psVar15;
  pointer ppNVar16;
  bool bVar17;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> activeStates;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> newActives;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> eclos;
  map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  counter;
  stack<char,_std::deque<char,_std::allocator<char>_>_> s;
  ulong local_270;
  vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> local_260;
  undefined1 local_248 [40];
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  Node *local_208;
  pointer local_200;
  _Deque_base<char,_std::allocator<char>_> local_1f8;
  _Deque_base<char,_std::allocator<char>_> local_1a8;
  _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
  local_158;
  _Deque_base<char,_std::allocator<char>_> local_128;
  _Deque_base<char,_std::allocator<char>_> local_d0;
  
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_128,0);
  local_1f8._M_impl.super__Deque_impl_data._M_map._0_1_ = 0x7a;
  std::deque<char,_std::allocator<char>_>::emplace_back<char>
            ((deque<char,_std::allocator<char>_> *)&local_128,(char *)&local_1f8);
  pNVar11 = this->start;
  std::deque<char,_std::allocator<char>_>::deque
            ((deque<char,_std::allocator<char>_> *)&stack0xffffffffffffff80,
             (deque<char,_std::allocator<char>_> *)&local_128);
  pPVar13 = (Pda *)&stack0xffffffffffffff80;
  Tjen::Node::setStack(pNVar11,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)pPVar13);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base
            ((_Deque_base<char,_std::allocator<char>_> *)&stack0xffffffffffffff80);
  findEclosure(&local_260,pPVar13,this->start);
  local_248._24_8_ = this;
  if (input->_M_string_length != 0) {
    local_270 = 0;
    do {
      local_248._0_8_ = (Pda *)0x0;
      local_248._8_8_ = 0;
      local_248._16_8_ = 0;
      local_218._8_8_ =
           local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      pNVar11 = (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      if (local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          n = (Pda *)(pNVar11->name)._M_dataplus._M_p;
          local_208 = pNVar11;
          initMap((map<const_char,_unsigned_int,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
                   *)&local_158,pPVar13,(Node *)n);
          pvVar7 = Tjen::Node::getTransitions((Node *)n);
          ppNVar16 = (pointer)(pvVar7->
                              super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                              )._M_impl.super__Vector_impl_data._M_start;
          local_200 = (pointer)(pvVar7->
                               super__Vector_base<Tjen::Node::Transition_*,_std::allocator<Tjen::Node::Transition_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
          if (ppNVar16 != local_200) {
            do {
              cVar3 = Tjen::Node::Transition::getInput((Transition *)*ppNVar16);
              cVar1 = (input->_M_dataplus)._M_p[local_270];
              if (cVar3 == cVar1) {
                pcVar8 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar16);
                cVar4 = *pcVar8;
                pPVar13 = n;
                Tjen::Node::getStack
                          ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1f8,
                           (Node *)n);
                ppTVar9 = (pointer)local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                if (local_1f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_1f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  ppTVar9 = (pointer)(local_1f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1]
                                     + 0x200);
                }
                if (cVar4 != *(char *)((long)ppTVar9 + -1)) goto LAB_001093cd;
                std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1f8);
LAB_001094b7:
                pNVar11 = (Node *)operator_new(0x88);
                pNVar12 = Tjen::Node::Transition::getTo((Transition *)*ppNVar16);
                Tjen::Node::Node(pNVar11,pNVar12);
                Tjen::Node::getStack
                          ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_d0,
                           (Node *)n);
                Tjen::Node::setStack
                          (pNVar11,(stack<char,_std::deque<char,_std::allocator<char>_>_> *)
                                   &local_d0);
                std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
                pPVar13 = (Pda *)Tjen::Node::Transition::getNewstack_abi_cxx11_
                                           ((Transition *)*ppNVar16);
                Tjen::Node::editStack(pNVar11,(string *)pPVar13);
                findEclosure((vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)
                             (local_248 + 0x20),pPVar13,pNVar11);
                pPVar13 = (Pda *)local_248._0_8_;
                std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<Tjen::Node**,std::vector<Tjen::Node*,std::allocator<Tjen::Node*>>>>
                          ((vector<Tjen::Node*,std::allocator<Tjen::Node*>> *)local_248,
                           local_248._0_8_,local_248._32_8_,local_220);
                if ((pointer)local_248._32_8_ != (pointer)0x0) {
                  pPVar13 = (Pda *)(local_218._M_allocated_capacity - local_248._32_8_);
                  operator_delete((void *)local_248._32_8_,(ulong)pPVar13);
                }
              }
              else {
LAB_001093cd:
                cVar4 = Tjen::Node::Transition::getInput((Transition *)*ppNVar16);
                if (cVar4 == ' ') {
                  pcVar8 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar16);
                  cVar5 = *pcVar8;
                  pPVar13 = n;
                  Tjen::Node::getStack
                            ((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_1a8,
                             (Node *)n);
                  pcVar10 = local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (local_1a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_1a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pcVar10 = local_1a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x200
                    ;
                  }
                  bVar17 = true;
                  this = (Pda *)local_248._24_8_;
                  if (cVar5 != pcVar10[-1]) goto LAB_00109433;
LAB_00109482:
                  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1a8);
                }
                else {
LAB_00109433:
                  cVar5 = Tjen::Node::Transition::getInput((Transition *)*ppNVar16);
                  if (cVar5 == (input->_M_dataplus)._M_p[local_270]) {
                    pcVar8 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar16);
                    bVar17 = true;
                    if (*pcVar8 != ' ') goto LAB_0010945d;
                  }
                  else {
LAB_0010945d:
                    cVar5 = Tjen::Node::Transition::getInput((Transition *)*ppNVar16);
                    if (cVar5 == ' ') {
                      pcVar8 = Tjen::Node::Transition::getOldStack((Transition *)*ppNVar16);
                      bVar17 = *pcVar8 == ' ';
                    }
                    else {
                      bVar17 = false;
                    }
                  }
                  if (cVar4 == ' ') goto LAB_00109482;
                }
                if (cVar3 == cVar1) {
                  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_1f8);
                }
                if (bVar17) goto LAB_001094b7;
              }
              ppNVar16 = ppNVar16 + 1;
            } while (ppNVar16 != local_200);
          }
          std::
          _Rb_tree<const_char,_std::pair<const_char,_unsigned_int>,_std::_Select1st<std::pair<const_char,_unsigned_int>_>,_std::less<const_char>,_std::allocator<std::pair<const_char,_unsigned_int>_>_>
          ::~_Rb_tree(&local_158);
          pNVar11 = (Node *)&(local_208->name)._M_string_length;
        } while (pNVar11 != (Node *)local_218._8_8_);
      }
      pPVar13 = (Pda *)local_248;
      std::vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>::operator=
                (&local_260,(vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *)pPVar13);
      if ((Pda *)local_248._0_8_ != (Pda *)0x0) {
        pPVar13 = (Pda *)(local_248._16_8_ - local_248._0_8_);
        operator_delete((void *)local_248._0_8_,(ulong)pPVar13);
      }
      local_270 = (ulong)((int)local_270 + 1);
    } while (local_270 < input->_M_string_length);
  }
  pNVar11 = (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  if (local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar17 = false;
  }
  else {
    do {
      ppNVar16 = (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppNVar2 = (this->endNodes).super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppNVar16 != ppNVar2) {
        pNVar12 = (Node *)(pNVar11->name)._M_dataplus._M_p;
        do {
          psVar14 = Tjen::Node::getName_abi_cxx11_(*ppNVar16);
          psVar15 = Tjen::Node::getName_abi_cxx11_(pNVar12);
          __n = psVar14->_M_string_length;
          if ((__n == psVar15->_M_string_length) &&
             ((bVar17 = true, __n == 0 ||
              (iVar6 = bcmp((psVar14->_M_dataplus)._M_p,(psVar15->_M_dataplus)._M_p,__n), iVar6 == 0
              )))) goto LAB_00109638;
          ppNVar16 = ppNVar16 + 1;
        } while (ppNVar16 != ppNVar2);
      }
      pNVar11 = (Node *)&(pNVar11->name)._M_string_length;
      this = (Pda *)local_248._24_8_;
    } while (pNVar11 !=
             (Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
    bVar17 = false;
  }
LAB_00109638:
  if ((Node *)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start != (Node *)0x0) {
    operator_delete(local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_128);
  return bVar17;
}

Assistant:

bool Pda::traverse(std::string input) {

    //init
    std::stack<char> s;
    s.push('z');
    this->getStart()->setStack(s);
    std::vector<Tjen::Node*> activeStates = {findEclosure(this->getStart())};


    //begin traverse
    for (unsigned int i = 0; i < input.size(); ++i) {
        std::vector<Tjen::Node*> newActives;


        // loop over active states
        for(Tjen::Node* n: activeStates){
            std::map<const char, unsigned int> counter = initMap(n);
            // loop over transition
            for(auto& f: n->getTransitions()){
                if((f->getInput() == input[i] && f->getOldStack() == n->getStack().top()) || (f->getInput() == ' ' && f->getOldStack() == n->getStack().top()) || (f->getInput() == input[i] && f->getOldStack() == ' ') || (f->getInput() == ' ' && f->getOldStack() == ' ') ){

                    //eclosurre adden

                    Tjen::Node* next = new Tjen::Node(f->getTo());
                    next->setStack(n->getStack());
                    next->editStack(f->getNewstack());
                    std::vector<Tjen::Node*> eclos = findEclosure(next);

                    newActives.insert(newActives.begin(),eclos.begin() , eclos.end());


                }
            }
        }
        activeStates = newActives;

    }

    for(Tjen::Node* n : activeStates){
        for(Tjen::Node* end : this->getEndNodes()){
            if(end->getName() == n->getName()){
                return true;
            }
        }
    }
    return false;

}